

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_pad(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int padEnd)

{
  int iVar1;
  uint to;
  uint uVar2;
  JSValueUnion p;
  JSValueUnion p_00;
  uint32_t to_00;
  uint count;
  JSValue JVar3;
  JSValue JVar4;
  uint local_64;
  JSValue local_60;
  StringBuffer local_50;
  
  JVar3 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar3.u;
  if ((int)JVar3.tag == 6) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar1 = JS_ToInt32Sat(ctx,(int *)&local_64,*argv);
  if (iVar1 != 0) goto LAB_0015940c;
  to = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
  count = local_64 - to;
  if (count == 0 || (int)local_64 < (int)to) {
    return JVar3;
  }
  uVar2 = 0x20;
  JVar4 = (JSValue)(ZEXT816(3) << 0x40);
  if (argc < 2) {
LAB_00159468:
    p_00.float64 = 0.0;
  }
  else {
    JVar4 = (JSValue)(ZEXT816(3) << 0x40);
    if ((int)argv[1].tag == 3) goto LAB_00159468;
    JVar4.tag = argv[1].tag;
    JVar4.u.ptr = argv[1].u.ptr;
    JVar4 = JS_ToString(ctx,JVar4);
    p_00 = JVar4.u;
    if ((int)JVar4.tag == 6) goto LAB_0015940c;
    uVar2 = (uint)*(ulong *)((long)p_00.ptr + 4);
    if ((uVar2 & 0x7fffffff) == 1) {
      if ((int)uVar2 < 0) {
        uVar2 = (uint)(ushort)(((JSString *)((long)p_00.ptr + 0x10))->header).ref_count;
      }
      else {
        uVar2 = (uint)(byte)(((JSString *)((long)p_00.ptr + 0x10))->header).ref_count;
      }
      goto LAB_00159468;
    }
    if ((*(ulong *)((long)p_00.ptr + 4) & 0x7fffffff) == 0) {
      JS_FreeValue(ctx,JVar4);
      return JVar3;
    }
    uVar2 = 0x20;
  }
  if (local_64 < 0x40000000) {
    local_60 = JVar4;
    iVar1 = string_buffer_init(ctx,&local_50,local_64);
    if (iVar1 == 0) {
      if ((padEnd == 0) ||
         (iVar1 = string_buffer_concat(&local_50,(JSString *)p.ptr,0,to), iVar1 == 0)) {
        if ((JSString *)p_00.ptr == (JSString *)0x0) {
          iVar1 = string_buffer_fill(&local_50,uVar2,count);
          if (iVar1 == 0) {
LAB_00159596:
            if ((padEnd != 0) ||
               (iVar1 = string_buffer_concat(&local_50,(JSString *)p.ptr,0,to), iVar1 == 0)) {
              JS_FreeValue(ctx,local_60);
              JS_FreeValue(ctx,JVar3);
              JVar3 = string_buffer_end(&local_50);
              return JVar3;
            }
          }
        }
        else {
          do {
            if ((int)count < 1) goto LAB_00159596;
            to_00 = *(uint *)((long)p_00.ptr + 4) & 0x7fffffff;
            if (count < to_00) {
              to_00 = count;
            }
            iVar1 = string_buffer_concat(&local_50,(JSString *)p_00.ptr,0,to_00);
            count = count - to_00;
          } while (iVar1 == 0);
        }
      }
      (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
    }
    JS_FreeValue(ctx,local_60);
  }
  else {
    JS_ThrowInternalError(ctx,"string too long");
  }
LAB_0015940c:
  JS_FreeValue(ctx,JVar3);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_pad(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int padEnd)
{
    JSValue str, v = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;
    JSString *p, *p1 = NULL;
    int n, len, c = ' ';

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail1;
    if (JS_ToInt32Sat(ctx, &n, argv[0]))
        goto fail2;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len >= n)
        return str;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        v = JS_ToString(ctx, argv[1]);
        if (JS_IsException(v))
            goto fail2;
        p1 = JS_VALUE_GET_STRING(v);
        if (p1->len == 0) {
            JS_FreeValue(ctx, v);
            return str;
        }
        if (p1->len == 1) {
            c = string_get(p1, 0);
            p1 = NULL;
        }
    }
    if (n > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail2;
    }
    if (string_buffer_init(ctx, b, n))
        goto fail3;
    n -= len;
    if (padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    if (p1) {
        while (n > 0) {
            int chunk = min_int(n, p1->len);
            if (string_buffer_concat(b, p1, 0, chunk))
                goto fail;
            n -= chunk;
        }
    } else {
        if (string_buffer_fill(b, c, n))
            goto fail;
    }
    if (!padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    JS_FreeValue(ctx, v);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
fail3:
    JS_FreeValue(ctx, v);
fail2:
    JS_FreeValue(ctx, str);
fail1:
    return JS_EXCEPTION;
}